

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.hpp
# Opt level: O3

void __thiscall
poplar::
map<poplar::compact_bonsai_trie<90U,_5U,_poplar::compact_hash_table<7U,_80U,_poplar::bijective_hash::split_mix_hasher>,_poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>,_poplar::bijective_hash::split_mix_hasher>,_poplar::compact_bonsai_nlm<int,_16UL>_>
::map(map<poplar::compact_bonsai_trie<90U,_5U,_poplar::compact_hash_table<7U,_80U,_poplar::bijective_hash::split_mix_hasher>,_poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>,_poplar::bijective_hash::split_mix_hasher>,_poplar::compact_bonsai_nlm<int,_16UL>_>
      *this,uint32_t capa_bits,uint64_t lambda)

{
  undefined8 *puVar1;
  uint32_t uVar2;
  undefined1 auVar3 [64];
  undefined1 auVar4 [64];
  compact_bonsai_trie<90U,_5U,_poplar::compact_hash_table<7U,_80U,_poplar::bijective_hash::split_mix_hasher>,_poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>,_poplar::bijective_hash::split_mix_hasher>
  cStack_168;
  
  auVar3 = ZEXT1664((undefined1  [16])0x0);
  this->is_ready_ = false;
  this->lambda_ = 0x20;
  (this->hash_trie_).hasher_.shift_ = 0;
  (this->hash_trie_).hasher_.univ_size_.bits_ = 0;
  (this->hash_trie_).aux_cht_.hasher_.univ_size_.bits_ = 0;
  (this->hash_trie_).aux_cht_.univ_size_.mask_ = 0;
  (this->hash_trie_).aux_cht_.capa_size_.bits_ = 0;
  (this->hash_trie_).aux_cht_.capa_size_.mask_ = 0;
  (this->hash_trie_).aux_cht_.quo_size_.bits_ = 0;
  auVar4 = vmovdqu64_avx512f(auVar3);
  *(undefined1 (*) [64])&(this->hash_trie_).aux_cht_.hasher_.univ_size_.mask_ = auVar4;
  auVar4 = vmovdqu64_avx512f(auVar3);
  *(undefined1 (*) [64])
   ((long)&(this->hash_trie_).aux_cht_.table_.chunks_.
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data + 4) = auVar4;
  (this->hash_trie_).capa_size_.mask_ = 0;
  (this->hash_trie_).symb_size_.bits_ = 0;
  (this->hash_trie_).hasher_.univ_size_.mask_ = 0;
  (this->hash_trie_).table_.chunks_.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->hash_trie_).table_.chunks_.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->hash_trie_).table_.chunks_.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  *(undefined8 *)
   ((long)&(this->hash_trie_).table_.chunks_.
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage + 4) = 0;
  *(undefined8 *)((long)&(this->hash_trie_).table_.size_ + 4) = 0;
  *(undefined8 *)((long)&(this->hash_trie_).table_.mask_ + 4) = 0;
  *(undefined8 *)((long)&(this->hash_trie_).table_.width_ + 4) = 0;
  auVar4 = vmovdqu64_avx512f(auVar3);
  *(undefined1 (*) [64])&(this->hash_trie_).aux_cht_.quo_size_.mask_ = auVar4;
  (this->hash_trie_).aux_map_.capa_size_.bits_ = 0;
  *(undefined1 (*) [16])&(this->hash_trie_).aux_map_.capa_size_.mask_ = ZEXT416(0) << 0x40;
  *(undefined1 (*) [16])((long)&(this->hash_trie_).size_ + 4) = ZEXT416(0) << 0x40;
  this->size_ = 0;
  auVar4 = vmovdqu64_avx512f(auVar3);
  *(undefined1 (*) [64])((this->codes_)._M_elems + 0xb8) = auVar4;
  auVar4 = vmovdqu64_avx512f(auVar3);
  *(undefined1 (*) [64])&(this->hash_trie_).symb_size_.mask_ = auVar4;
  auVar4 = vmovdqu64_avx512f(auVar3);
  *(undefined1 (*) [64])&(this->label_store_).label_bytes_ = auVar4;
  auVar4 = vmovdqu64_avx512f(auVar3);
  *(undefined1 (*) [64])((this->codes_)._M_elems + 0x38) = auVar4;
  auVar4 = vmovdqu64_avx512f(auVar3);
  *(undefined1 (*) [64])((this->codes_)._M_elems + 0x78) = auVar4;
  auVar4 = vmovdqu64_avx512f(auVar3);
  *(undefined1 (*) [64])((this->codes_)._M_elems + 0xc4) = auVar4;
  if ((int)POPCOUNT(lambda) == 1) {
    this->is_ready_ = true;
    this->lambda_ = lambda;
    uVar2 = 8;
    if (1 < lambda) {
      uVar2 = 0x48 - (int)LZCOUNT(lambda - 1);
    }
    auVar4 = ZEXT2464(ZEXT1624((undefined1  [16])0x0));
    compact_bonsai_trie<90U,_5U,_poplar::compact_hash_table<7U,_80U,_poplar::bijective_hash::split_mix_hasher>,_poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>,_poplar::bijective_hash::split_mix_hasher>
    ::compact_bonsai_trie(&cStack_168,capa_bits,uVar2,0);
    compact_bonsai_trie<90U,_5U,_poplar::compact_hash_table<7U,_80U,_poplar::bijective_hash::split_mix_hasher>,_poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>,_poplar::bijective_hash::split_mix_hasher>
    ::operator=(&this->hash_trie_,&cStack_168);
    compact_bonsai_trie<90U,_5U,_poplar::compact_hash_table<7U,_80U,_poplar::bijective_hash::split_mix_hasher>,_poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>,_poplar::bijective_hash::split_mix_hasher>
    ::~compact_bonsai_trie(&cStack_168);
    compact_bonsai_nlm<int,_16UL>::compact_bonsai_nlm
              ((compact_bonsai_nlm<int,_16UL> *)&cStack_168,(this->hash_trie_).capa_size_.bits_);
    compact_bonsai_nlm<int,_16UL>::operator=
              (&this->label_store_,(compact_bonsai_nlm<int,_16UL> *)&cStack_168);
    compact_bonsai_nlm<int,_16UL>::~compact_bonsai_nlm((compact_bonsai_nlm<int,_16UL> *)&cStack_168)
    ;
    auVar3 = vpternlogd_avx512f(auVar4,auVar4,auVar4,0xff);
    auVar4 = vmovdqu64_avx512f(auVar3);
    *(undefined1 (*) [64])(this->codes_)._M_elems = auVar4;
    auVar4 = vmovdqu64_avx512f(auVar3);
    *(undefined1 (*) [64])((this->codes_)._M_elems + 0xc0) = auVar4;
    auVar4 = vmovdqu64_avx512f(auVar3);
    *(undefined1 (*) [64])((this->codes_)._M_elems + 0x80) = auVar4;
    auVar4 = vmovdqu64_avx512f(auVar3);
    *(undefined1 (*) [64])((this->codes_)._M_elems + 0x40) = auVar4;
    uVar2 = this->num_codes_;
    this->num_codes_ = uVar2 + 1;
    (this->codes_)._M_elems[0] = (uchar)uVar2;
    return;
  }
  puVar1 = (undefined8 *)__cxa_allocate_exception(0x10);
  *puVar1 = &PTR__exception_0016cab0;
  puVar1[1] = 
  "/workspace/llm4binary/github/license_c_cmakelists/kampersanda[P]poplar-trie/include/poplar/map.hpp:57:lambda must be a power of 2."
  ;
  __cxa_throw(puVar1,&exception::typeinfo,std::exception::~exception);
}

Assistant:

explicit map(uint32_t capa_bits, uint64_t lambda = 32) {
        POPLAR_THROW_IF(!is_power2(lambda), "lambda must be a power of 2.");

        is_ready_ = true;
        lambda_ = lambda;
        hash_trie_ = Trie{capa_bits, 8 + bit_tools::ceil_log2(lambda_)};
        label_store_ = NLM{hash_trie_.capa_bits()};
        codes_.fill(UINT8_MAX);
        codes_[0] = static_cast<uint8_t>(num_codes_++);  // terminator
    }